

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O0

int get_model_rd_index_for_pruning(MACROBLOCK *x,INTRA_MODE_SPEED_FEATURES *intra_sf)

{
  PREDICTION_MODE PVar1;
  bool bVar2;
  bool bVar3;
  int local_40;
  int local_3c;
  int is_above_mode_neq_cur_mode;
  int is_left_mode_neq_cur_mode;
  int model_rd_index_for_pruning;
  PREDICTION_MODE mode;
  MACROBLOCKD *xd;
  int top_intra_model_count_allowed;
  INTRA_MODE_SPEED_FEATURES *intra_sf_local;
  MACROBLOCK *x_local;
  int local_4;
  
  local_4 = intra_sf->top_intra_model_count_allowed;
  if (intra_sf->adapt_top_model_rd_count_using_neighbors == 0) {
    local_4 = local_4 + -1;
  }
  else {
    PVar1 = (*(x->e_mbd).mi)->mode;
    model_rd_index_for_pruning = local_4 + -1;
    bVar2 = false;
    bVar3 = false;
    if (((x->e_mbd).left_available & 1U) != 0) {
      bVar2 = ((x->e_mbd).left_mbmi)->mode != PVar1;
    }
    if (((x->e_mbd).up_available & 1U) != 0) {
      bVar3 = ((x->e_mbd).above_mbmi)->mode != PVar1;
    }
    if (x->qindex < 0x80) {
      if ((bVar2) || (bVar3)) {
        if (local_4 + -2 < 1) {
          local_3c = 0;
        }
        else {
          local_3c = local_4 + -2;
        }
        model_rd_index_for_pruning = local_3c;
      }
    }
    else if ((bVar2) && (bVar3)) {
      if (local_4 + -2 < 1) {
        local_40 = 0;
      }
      else {
        local_40 = local_4 + -2;
      }
      model_rd_index_for_pruning = local_40;
    }
    local_4 = model_rd_index_for_pruning;
  }
  return local_4;
}

Assistant:

static inline int get_model_rd_index_for_pruning(
    const MACROBLOCK *const x,
    const INTRA_MODE_SPEED_FEATURES *const intra_sf) {
  const int top_intra_model_count_allowed =
      intra_sf->top_intra_model_count_allowed;
  if (!intra_sf->adapt_top_model_rd_count_using_neighbors)
    return top_intra_model_count_allowed - 1;

  const MACROBLOCKD *const xd = &x->e_mbd;
  const PREDICTION_MODE mode = xd->mi[0]->mode;
  int model_rd_index_for_pruning = top_intra_model_count_allowed - 1;
  int is_left_mode_neq_cur_mode = 0, is_above_mode_neq_cur_mode = 0;
  if (xd->left_available)
    is_left_mode_neq_cur_mode = xd->left_mbmi->mode != mode;
  if (xd->up_available)
    is_above_mode_neq_cur_mode = xd->above_mbmi->mode != mode;
  // The pruning of luma intra modes is made more aggressive at lower quantizers
  // and vice versa. The value for model_rd_index_for_pruning is derived as
  // follows.
  // qidx 0 to 127: Reduce the index of a candidate used for comparison only if
  // the current mode does not match either of the available neighboring modes.
  // qidx 128 to 255: Reduce the index of a candidate used for comparison only
  // if the current mode does not match both the available neighboring modes.
  if (x->qindex <= 127) {
    if (is_left_mode_neq_cur_mode || is_above_mode_neq_cur_mode)
      model_rd_index_for_pruning = AOMMAX(model_rd_index_for_pruning - 1, 0);
  } else {
    if (is_left_mode_neq_cur_mode && is_above_mode_neq_cur_mode)
      model_rd_index_for_pruning = AOMMAX(model_rd_index_for_pruning - 1, 0);
  }
  return model_rd_index_for_pruning;
}